

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O2

vector<TCacheReq,_std::allocator<TCacheReq>_> *
PriorityQueueAssignment
          (vector<TCacheReq,_std::allocator<TCacheReq>_> *__return_storage_ptr__,TProblem *p)

{
  pointer puVar1;
  mapped_type mVar2;
  pointer pTVar3;
  pointer pTVar4;
  double dVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  ostream *poVar9;
  ulong uVar10;
  iterator iVar11;
  TRequest *request;
  pointer pTVar12;
  size_t v;
  pointer ppVar13;
  ulong uVar14;
  size_t e;
  pointer ppVar15;
  ulong uVar16;
  TCacheConn *cacheConn;
  pointer pTVar17;
  TCacheReq cacheRequest_1;
  value_type local_118;
  priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
  local_f8;
  vector<TCacheReq,_std::allocator<TCacheReq>_> *local_d8;
  _Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_d0;
  TCacheReq cacheRequest;
  key_type local_b0;
  unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
  serveTime;
  unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
  addedCacheRequests;
  
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  serveTime._M_h._M_buckets = &serveTime._M_h._M_single_bucket;
  serveTime._M_h._M_bucket_count = 1;
  serveTime._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  serveTime._M_h._M_element_count = 0;
  serveTime._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  serveTime._M_h._M_rehash_policy._M_next_resize = 0;
  serveTime._M_h._M_single_bucket = (__node_base_ptr)0x0;
  addedCacheRequests._M_h._M_buckets = &addedCacheRequests._M_h._M_single_bucket;
  addedCacheRequests._M_h._M_bucket_count = 1;
  addedCacheRequests._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  addedCacheRequests._M_h._M_element_count = 0;
  addedCacheRequests._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  addedCacheRequests._M_h._M_rehash_policy._M_next_resize = 0;
  addedCacheRequests._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d8 = __return_storage_ptr__;
  for (ppVar15 = (pointer)0x0;
      ppVar15 < (pointer)((long)(p->Endpoints).
                                super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(p->Endpoints).
                                super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                                super__Vector_impl_data._M_start >> 5);
      ppVar15 = (pointer)((long)&(ppVar15->first).ServerId + 1)) {
    for (ppVar13 = (pointer)0x0;
        ppVar13 < (pointer)((long)(p->Vides).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(p->Vides).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3);
        ppVar13 = (pointer)((long)&(ppVar13->first).ServerId + 1)) {
      mVar2 = (p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
              super__Vector_impl_data._M_start[(long)ppVar15].Latency;
      local_f8.c.
      super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar15;
      local_f8.c.
      super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar13;
      pmVar7 = std::__detail::
               _Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&serveTime,(key_type *)&local_f8);
      *pmVar7 = mVar2;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Serve times initialized\n");
  local_f8.c.
  super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.c.
  super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.c.
  super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.first.ServerId = 0;
  local_118.first.VideoId = 0;
  local_118.second = 0;
  std::
  _Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                   *)&local_118);
  local_d0 = (_Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(p->Requests).super__Vector_base<TRequest,_std::allocator<TRequest>_>._M_impl.
                super__Vector_impl_data._M_finish;
  for (pTVar12 = (p->Requests).super__Vector_base<TRequest,_std::allocator<TRequest>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (_Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)pTVar12 != local_d0; pTVar12 = pTVar12 + 1) {
    pTVar3 = (p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar4 = *(pointer *)
              ((long)&pTVar3[pTVar12->EndpointId].Caches.
                      super__Vector_base<TCacheConn,_std::allocator<TCacheConn>_>._M_impl + 8);
    for (pTVar17 = *(pointer *)
                    &pTVar3[pTVar12->EndpointId].Caches.
                     super__Vector_base<TCacheConn,_std::allocator<TCacheConn>_>._M_impl;
        pTVar17 != pTVar4; pTVar17 = pTVar17 + 1) {
      cacheRequest.ServerId = pTVar17->ServerId;
      cacheRequest.VideoId = pTVar12->VideoId;
      sVar8 = std::
              _Hashtable<TCacheReq,_TCacheReq,_std::allocator<TCacheReq>,_std::__detail::_Identity,_std::equal_to<TCacheReq>,_std::hash<TCacheReq>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&addedCacheRequests._M_h,&cacheRequest);
      if (sVar8 == 0) {
        std::__detail::
        _Insert_base<TCacheReq,_TCacheReq,_std::allocator<TCacheReq>,_std::__detail::_Identity,_std::equal_to<TCacheReq>,_std::hash<TCacheReq>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<TCacheReq,_TCacheReq,_std::allocator<TCacheReq>,_std::__detail::_Identity,_std::equal_to<TCacheReq>,_std::hash<TCacheReq>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&addedCacheRequests._M_h,&cacheRequest);
        dVar5 = CalcPriority(p,&serveTime,&cacheRequest);
        local_118.first.ServerId = cacheRequest.ServerId;
        local_118.first.VideoId = cacheRequest.VideoId;
        local_118.second = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5
        ;
        std::
        priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
        ::push(&local_f8,&local_118);
      }
    }
  }
  std::operator<<((ostream *)&std::cerr,"Starting\n");
  std::ostream::flush();
  local_d0 = &(p->Latencies)._M_h;
  while (local_f8.c.
         super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_f8.c.
         super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"\rQueue size: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::ostream::flush();
    cacheRequest.ServerId =
         ((local_f8.c.
           super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->first).ServerId;
    cacheRequest.VideoId =
         ((local_f8.c.
           super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->first).VideoId;
    uVar16 = (local_f8.c.
              super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->second;
    if (0x18 < (long)local_f8.c.
                     super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_f8.c.
                     super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
      local_118.second =
           local_f8.c.
           super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].second;
      local_118.first.ServerId =
           local_f8.c.
           super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].first.ServerId;
      local_118.first.VideoId =
           local_f8.c.
           super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].first.VideoId;
      sVar6 = ((local_f8.c.
                super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first).VideoId;
      local_f8.c.
      super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].first.ServerId =
           ((local_f8.c.
             super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first).ServerId;
      local_f8.c.
      super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].first.VideoId = sVar6;
      local_f8.c.
      super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].second =
           (local_f8.c.
            super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->second;
      std::
      __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<TCacheReq,unsigned_long>*,std::vector<std::pair<TCacheReq,unsigned_long>,std::allocator<std::pair<TCacheReq,unsigned_long>>>>,long,std::pair<TCacheReq,unsigned_long>,__gnu_cxx::__ops::_Iter_comp_iter<PriorityQueueAssignment(TProblem&)::__0>>
                (local_f8.c.
                 super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0,
                 ((long)local_f8.c.
                        super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                 (-0x18 - (long)local_f8.c.
                                super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) / 0x18);
    }
    local_f8.c.
    super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_f8.c.
         super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    cacheRequest_1.ServerId = cacheRequest.ServerId;
    cacheRequest_1.VideoId = cacheRequest.VideoId;
    if ((p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[cacheRequest.VideoId] <=
        (p->Capacities).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[cacheRequest.ServerId]) {
      dVar5 = CalcPriority(p,&serveTime,&cacheRequest_1);
      uVar10 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
      if (uVar16 == uVar10) {
        if ((p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[cacheRequest_1.VideoId] <=
            (p->Capacities).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[cacheRequest_1.ServerId]) {
          std::vector<TCacheReq,_std::allocator<TCacheReq>_>::push_back(local_d8,&cacheRequest_1);
          puVar1 = (p->Capacities).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start + cacheRequest_1.ServerId;
          *puVar1 = *puVar1 - (p->Vides).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[cacheRequest_1.VideoId];
          for (uVar16 = 0;
              uVar16 < (ulong)((long)(p->Endpoints).
                                     super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(p->Endpoints).
                                     super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 5);
              uVar16 = uVar16 + 1) {
            local_118.first.VideoId = cacheRequest_1.ServerId;
            local_118.first.ServerId = uVar16;
            iVar11 = std::
                     _Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(local_d0,(key_type *)&local_118);
            if (iVar11.
                super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>.
                _M_cur != (__node_type *)0x0) {
              local_118.first.VideoId = cacheRequest_1.VideoId;
              local_118.first.ServerId = uVar16;
              pmVar7 = std::__detail::
                       _Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&serveTime,(key_type *)&local_118);
              uVar10 = *(ulong *)((long)iVar11.
                                        super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                                        ._M_cur + 0x18);
              uVar14 = *pmVar7;
              local_b0.VideoId = cacheRequest_1.VideoId;
              local_b0.EndpointId = uVar16;
              pmVar7 = std::__detail::
                       _Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&serveTime,&local_b0);
              if (uVar10 < uVar14) {
                uVar14 = uVar10;
              }
              *pmVar7 = uVar14;
            }
          }
        }
      }
      else {
        local_118.first.ServerId = cacheRequest_1.ServerId;
        local_118.first.VideoId = cacheRequest_1.VideoId;
        local_118.second = uVar10;
        std::
        priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
        ::push(&local_f8,&local_118);
      }
    }
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::
  _Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                   *)&local_f8);
  std::
  _Hashtable<TCacheReq,_TCacheReq,_std::allocator<TCacheReq>,_std::__detail::_Identity,_std::equal_to<TCacheReq>,_std::hash<TCacheReq>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&addedCacheRequests._M_h);
  std::
  _Hashtable<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&serveTime._M_h);
  return local_d8;
}

Assistant:

std::vector<TCacheReq> PriorityQueueAssignment(TProblem& p) {
    std::vector<TCacheReq> result;
    std::unordered_map<TEndpointVideo, size_t> serveTime;
    std::unordered_set<TCacheReq> addedCacheRequests;
    for (size_t e = 0; e < p.Endpoints.size(); ++e) {
        for (size_t v = 0; v < p.Vides.size(); ++v) {
            serveTime[{e, v}] = p.Endpoints[e].Latency;
        }
    }
    std::cerr << "Serve times initialized\n";
    auto cmp = [&](auto& lhs, auto& rhs) { return lhs.second < rhs.second; };
    std::priority_queue<QueueEntry, std::vector<QueueEntry>, decltype(cmp)> queue(cmp);
    for (auto& request : p.Requests) {
        for (auto& cacheConn : p.Endpoints[request.EndpointId].Caches) {
            TCacheReq cacheRequest{cacheConn.ServerId, request.VideoId};
            if (addedCacheRequests.count(cacheRequest)) {
                continue;
            }
            addedCacheRequests.insert(cacheRequest);
            queue.push({cacheRequest, CalcPriority(p, serveTime, cacheRequest)});
        }
    }
    std::cerr << "Starting\n" << std::flush;
    while (!queue.empty()) {
        std::cerr << "\rQueue size: " << queue.size() << std::flush;
        auto entry = queue.top();
        queue.pop();
        auto cacheRequest = entry.first;
        if (p.Capacities[cacheRequest.ServerId] < p.Vides[cacheRequest.VideoId]) {
            continue;
        }
        size_t priority = entry.second;
        size_t newPriority = CalcPriority(p, serveTime, cacheRequest);
        if (entry.second != newPriority) {
            queue.push({cacheRequest, newPriority});
            continue;
        }
        if (p.Capacities[cacheRequest.ServerId] < p.Vides[cacheRequest.VideoId]) {
            continue;
        }
        result.push_back(cacheRequest);
        p.Capacities[cacheRequest.ServerId] -= p.Vides[cacheRequest.VideoId];
        for (size_t e = 0; e < p.Endpoints.size(); ++e) {
            auto foundLatency = p.Latencies.find({e, cacheRequest.ServerId});
            if (foundLatency == p.Latencies.end()) {
                continue;
            }
            serveTime[{e, cacheRequest.VideoId}] =
                std::min(serveTime[{e, cacheRequest.VideoId}], foundLatency->second);
        }
    }
    std::cerr << "\n";
    return result;
}